

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

string * rcg::getEnum(string *__return_storage_ptr__,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
                     char *name,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *list,bool exception)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  gcstring *this;
  char *pcVar4;
  long *plVar5;
  char *__s;
  invalid_argument *piVar6;
  size_type *psVar7;
  ulong uVar8;
  StringList_t entries;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [2];
  long *local_50;
  gcstring_vector local_48 [16];
  char *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(list);
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_a0);
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
  if (plVar5 == (long *)0x0) {
    if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Feature not found: ","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_c0);
      local_a0[0]._M_dataplus._M_p = (pointer)*plVar5;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_a0[0]._M_dataplus._M_p == psVar7) {
        local_a0[0].field_2._0_8_ = *psVar7;
        local_a0[0].field_2._8_8_ = plVar5[3];
        local_a0[0]._M_dataplus._M_p = (pointer)&local_a0[0].field_2;
      }
      else {
        local_a0[0].field_2._0_8_ = *psVar7;
      }
      local_a0[0]._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar6,(string *)local_a0);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar5 + *(long *)(*plVar5 + -0x28)))
                      ((long)plVar5 + *(long *)(*plVar5 + -0x28));
    if (iVar2 - 3U < 2) {
      local_50 = (long *)__dynamic_cast(plVar5,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      if (local_50 == (long *)0x0) {
        if (exception) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_c0[0] = local_b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Feature not enumeration: ","");
          plVar5 = (long *)std::__cxx11::string::append((char *)local_c0);
          local_a0[0]._M_dataplus._M_p = (pointer)*plVar5;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_a0[0]._M_dataplus._M_p == psVar7) {
            local_a0[0].field_2._0_8_ = *psVar7;
            local_a0[0].field_2._8_8_ = plVar5[3];
            local_a0[0]._M_dataplus._M_p = (pointer)&local_a0[0].field_2;
          }
          else {
            local_a0[0].field_2._0_8_ = *psVar7;
          }
          local_a0[0]._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar6,(string *)local_a0);
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        GenICam_3_4::gcstring_vector::gcstring_vector(local_48);
        local_38 = name;
        (**(code **)(*local_50 + 0x38))(local_50,local_48);
        uVar8 = 0;
        while( true ) {
          uVar3 = GenICam_3_4::gcstring_vector::size();
          if (uVar3 <= uVar8) break;
          this = (gcstring *)GenICam_3_4::gcstring_vector::operator[]((ulong)local_48);
          pcVar4 = GenICam_3_4::gcstring::operator_cast_to_char_(this);
          std::__cxx11::string::string((string *)local_a0,pcVar4,(allocator *)local_c0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,
                     local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0[0]._M_dataplus._M_p != &local_a0[0].field_2) {
            operator_delete(local_a0[0]._M_dataplus._M_p);
          }
          uVar8 = uVar8 + 1;
        }
        plVar5 = (long *)(**(code **)(*local_50 + 0x78))(local_50,0,0);
        if (plVar5 == (long *)0x0) {
          if (exception) {
            piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
            local_c0[0] = local_b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c0,"Current value is not defined: ","");
            plVar5 = (long *)std::__cxx11::string::append((char *)local_c0);
            local_a0[0]._M_dataplus._M_p = (pointer)*plVar5;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((size_type *)local_a0[0]._M_dataplus._M_p == psVar7) {
              local_a0[0].field_2._0_8_ = *psVar7;
              local_a0[0].field_2._8_8_ = plVar5[3];
              local_a0[0]._M_dataplus._M_p = (pointer)&local_a0[0].field_2;
            }
            else {
              local_a0[0].field_2._0_8_ = *psVar7;
            }
            local_a0[0]._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::invalid_argument::invalid_argument(piVar6,(string *)local_a0);
            __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          (**(code **)(*plVar5 + 0x40))(local_a0);
          __s = GenICam_3_4::gcstring::operator_cast_to_char_((gcstring *)local_a0);
          pcVar4 = (char *)__return_storage_ptr__->_M_string_length;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar4,(ulong)__s);
          GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
        }
        GenICam_3_4::gcstring_vector::~gcstring_vector(local_48);
      }
    }
    else if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Feature not readable: ","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_c0);
      local_a0[0]._M_dataplus._M_p = (pointer)*plVar5;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_a0[0]._M_dataplus._M_p == psVar7) {
        local_a0[0].field_2._0_8_ = *psVar7;
        local_a0[0].field_2._8_8_ = plVar5[3];
        local_a0[0]._M_dataplus._M_p = (pointer)&local_a0[0].field_2;
      }
      else {
        local_a0[0].field_2._0_8_ = *psVar7;
      }
      local_a0[0]._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar6,(string *)local_a0);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    std::vector<std::string> &list, bool exception)
{
  std::string ret;

  list.clear();

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::StringList_t entries;
          val->GetSymbolics(entries);

          for (size_t i=0; i<entries.size(); i++)
          {
            list.push_back(std::string(entries[i]));
          }

          GenApi::IEnumEntry *entry=val->GetCurrentEntry();

          if (entry != 0)
          {
            ret=entry->GetSymbolic();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Current value is not defined: ")+name);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}